

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buflist.c
# Opt level: O2

size_t lws_buflist_total_len(lws_buflist **head)

{
  size_t size;
  
  size = 0;
  while (head = &((lws_buflist *)head)->next->next, (lws_buflist *)head != (lws_buflist *)0x0) {
    size = size + ((lws_buflist *)head)->len;
  }
  return size;
}

Assistant:

size_t
lws_buflist_total_len(struct lws_buflist **head)
{
	struct lws_buflist *p = *head;
	size_t size = 0;

	while (p) {
		size += p->len;
		p = p->next;
	}

	return size;
}